

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

void __thiscall pbrt::ImageTileIntegrator::Render(ImageTileIntegrator *this)

{
  SamplerHandle *pSVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  optional<float> oVar7;
  int iVar8;
  aligned_storage_t<sizeof(float),_alignof(float)> aVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  Allocator AVar11;
  ulong uVar12;
  Bounds2<int> *pBVar13;
  Image *pIVar14;
  FILE *pFVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  string *name;
  long lVar19;
  int iVar20;
  char *fmt;
  ulong uVar21;
  ImageTileIntegrator *pIVar22;
  int iVar23;
  long in_FS_OFFSET;
  Float FVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  string_view str;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  CheckCallbackScope _;
  int waveStart;
  int waveEnd;
  vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> scratchBuffers;
  Bounds2i cropBounds;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> samplers;
  Point2i pPixel;
  Point2i va;
  ProgressReporter progress;
  optional<pbrt::Image> referenceImage;
  ScratchBuffer scratchBuffer;
  int in_stack_fffffffffffff704;
  CheckCallbackScope local_8f1;
  uint local_8f0;
  uint local_8ec;
  uint local_8e8;
  allocator_type local_8e3;
  allocator<char> local_8e2;
  allocator<char> local_8e1;
  aligned_storage_t<sizeof(float),_alignof(float)> local_8e0;
  int iStack_8dc;
  aligned_storage_t<sizeof(float),_alignof(float)> aStack_8d8;
  int iStack_8d4;
  ImageTileIntegrator *local_8c8;
  optional<float> local_8c0;
  undefined8 uStack_8b8;
  FILE *local_8a8;
  optional<float> local_8a0;
  undefined8 uStack_898;
  _Base_ptr local_890;
  _Rb_tree_node_base *local_888;
  _Any_data local_880;
  code *pcStack_870;
  code *pcStack_868;
  undefined1 local_850 [16];
  pointer local_840;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_830;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_800;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7d0;
  _Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> local_7b8;
  _Any_data local_7a0;
  code *pcStack_790;
  code *pcStack_788;
  ColorEncodingHandle local_780;
  uintptr_t local_778;
  ImageMetadata local_770;
  undefined1 local_668 [172];
  bool local_5bc;
  optional<int> local_5b8;
  optional<float> local_5b0 [2];
  bool local_5a0;
  _Rb_tree_node_base local_590;
  polymorphic_allocator<float> local_570;
  ProgressReporter local_550;
  _Any_data local_500;
  code *local_4f0;
  code *local_4e8;
  optional<pbrt::Image> local_4e0;
  undefined1 local_3c0 [64];
  string local_380 [360];
  optional<pbrt::Bounds2<int>_> local_218 [8];
  ImageMetadata local_178;
  
  local_8c8 = this;
  if (*(size_t *)(Options + 0x90) != 0) {
    str._M_str = *(char **)(Options + 0x88);
    str._M_len = *(size_t *)(Options + 0x90);
    SplitStringToInts((optional<std::vector<int,_std::allocator<int>_>_> *)&local_4e0,str,',');
    if (local_4e0.optionalValue.__data[0x18] == '\0') {
      fmt = "Didn\'t find integer values after --debugstart: %s";
    }
    else {
      pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                          ((optional<std::vector<int,_std::allocator<int>_>_> *)&local_4e0);
      if ((long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start == 0xc) {
        pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                            ((optional<std::vector<int,_std::allocator<int>_>_> *)&local_4e0);
        aVar9 = *(aligned_storage_t<sizeof(float),_alignof(float)> *)
                 (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                            ((optional<std::vector<int,_std::allocator<int>_>_> *)&local_4e0);
        local_770.renderTimeSeconds._4_4_ =
             (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[1];
        local_770.renderTimeSeconds.optionalValue = aVar9;
        pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                            ((optional<std::vector<int,_std::allocator<int>_>_> *)&local_4e0);
        uVar16 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[2];
        ScratchBuffer::ScratchBuffer((ScratchBuffer *)local_3c0,0x10000);
        pSVar1 = &local_8c8->samplerPrototype;
        AVar11.memoryResource = pstd::pmr::new_delete_resource();
        SamplerHandle::Clone
                  ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)local_668,
                   pSVar1,1,AVar11);
        local_550.totalWork = *(int64_t *)local_668._0_8_;
        std::_Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::~_Vector_base
                  ((_Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
                   local_668);
        SamplerHandle::StartPixelSample((SamplerHandle *)&local_550,(Point2i *)&local_770,uVar16,0);
        local_778 = local_550.totalWork;
        (*(local_8c8->super_Integrator)._vptr_Integrator[4])
                  (local_8c8,&local_770,(ulong)uVar16,&local_778,local_3c0);
        ScratchBuffer::~ScratchBuffer((ScratchBuffer *)local_3c0);
        pstd::optional<std::vector<int,_std::allocator<int>_>_>::~optional
                  ((optional<std::vector<int,_std::allocator<int>_>_> *)&local_4e0);
        return;
      }
      fmt = "Didn\'t find three integer values after --debugstart: %s";
    }
    ErrorExit<std::__cxx11::string&>
              (fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (Options + 0x88));
  }
  if (*(char *)(in_FS_OFFSET + -0x2e8) == '\0') {
    *(undefined8 *)(in_FS_OFFSET + -0x2f0) = 0;
    *(undefined1 *)(in_FS_OFFSET + -0x2e8) = 1;
  }
  local_500 = (_Any_data)0x0;
  local_4e8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:138:26)>
              ::_M_invoke;
  local_4f0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:138:26)>
              ::_M_manager;
  CheckCallbackScope::CheckCallbackScope
            (&local_8f1,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_500);
  std::_Function_base::~_Function_base((_Function_base *)&local_500);
  local_840 = (pointer)0x0;
  local_850 = (undefined1  [16])0x0;
  for (iVar23 = 0; iVar8 = MaxThreadIndex(), iVar23 < iVar8; iVar23 = iVar23 + 1) {
    ScratchBuffer::ScratchBuffer((ScratchBuffer *)local_3c0,0x10000);
    std::vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>::
    emplace_back<pbrt::ScratchBuffer>
              ((vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> *)local_850,
               (ScratchBuffer *)local_3c0);
    ScratchBuffer::~ScratchBuffer((ScratchBuffer *)local_3c0);
  }
  iVar23 = MaxThreadIndex();
  pIVar22 = local_8c8;
  pSVar1 = &local_8c8->samplerPrototype;
  AVar11.memoryResource = pstd::pmr::new_delete_resource();
  SamplerHandle::Clone
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)&local_7b8,pSVar1,
             iVar23,AVar11);
  uVar12 = *(ulong *)(((pIVar22->camera).
                       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                       .bits & 0xffffffffffff) + 0x340) & 0xffffffffffff;
  _local_8e0 = *(optional<float> *)(uVar12 + 8);
  _aStack_8d8 = *(optional<float> *)(uVar12 + 0x10);
  local_8ec = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
              ::Dispatch<pbrt::SamplerHandle::SamplesPerPixel()const::_lambda(auto:1)_1_>
                        ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                          *)pSVar1);
  local_8c0 = _aStack_8d8;
  uStack_8b8 = 0;
  local_8a0 = _local_8e0;
  uStack_898 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3c0,"Rendering",(allocator<char> *)&local_4e0);
  auVar3._8_8_ = uStack_8b8;
  auVar3._0_4_ = local_8c0.optionalValue;
  auVar3[4] = local_8c0.set;
  auVar3._5_3_ = local_8c0._5_3_;
  auVar4._8_8_ = uStack_898;
  auVar4._0_4_ = local_8a0.optionalValue;
  auVar4[4] = local_8a0.set;
  auVar4._5_3_ = local_8a0._5_3_;
  auVar4 = vpsubd_avx(auVar3,auVar4);
  auVar3 = vpshufd_avx(auVar4,0x55);
  auVar3 = vpmulld_avx(auVar3,auVar4);
  ProgressReporter::ProgressReporter
            (&local_550,(long)auVar3._0_4_ * (long)(int)local_8ec,(string *)local_3c0,
             *(bool *)(Options + 9),false);
  local_8c0 = (optional<float>)&local_8c8->camera;
  std::__cxx11::string::~string((string *)local_3c0);
  local_8f0 = 0;
  local_8e8 = 1;
  if (*(char *)(Options + 10) == '\x01') {
    local_668._0_8_ =
         *(optional<float> *)
          ((((TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              *)local_8c0)->bits & 0xffffffffffff) + 0x340);
    FilmHandle::GetFilename_abi_cxx11_((string *)&local_4e0,(FilmHandle *)local_668);
    RemoveExtension((string *)local_3c0,(string *)&local_4e0);
    StatsEnablePixelStats((Bounds2i *)&local_8e0.__align,(string *)local_3c0);
    std::__cxx11::string::~string((string *)local_3c0);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  local_4e0.set = false;
  if (*(long *)(Options + 0x50) != 0) {
    name = (string *)(Options + 0x48);
    AVar11.memoryResource = pstd::pmr::new_delete_resource();
    local_780.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    Image::Read((ImageAndMetadata *)local_3c0,name,AVar11,&local_780);
    pstd::optional<pbrt::Image>::operator=(&local_4e0,(Image *)local_3c0);
    if (local_218[0].set == true) {
      pBVar13 = pstd::optional<pbrt::Bounds2<int>_>::value(local_218);
      local_770.renderTimeSeconds =
           *(optional<float> *)&(pBVar13->pMin).super_Tuple2<pbrt::Point2,_int>;
      local_770.cameraFromWorld.optionalValue._0_8_ =
           (pBVar13->pMax).super_Tuple2<pbrt::Point2,_int>;
      aVar9 = local_770.renderTimeSeconds.optionalValue;
    }
    else {
      pIVar14 = pstd::optional<pbrt::Image>::value(&local_4e0);
      TVar2 = (pIVar14->resolution).super_Tuple2<pbrt::Point2,_int>;
      uVar12 = 0;
      uVar16 = TVar2.x;
      uVar18 = TVar2.y;
      aVar9 = (aligned_storage_t<sizeof(float),_alignof(float)>)((int)uVar16 >> 0x1f & uVar16);
      uVar21 = 0;
      if (0 < (int)uVar16) {
        uVar21 = (ulong)TVar2 & 0xffffffff;
      }
      local_770.renderTimeSeconds._4_4_ = (int)uVar18 >> 0x1f & uVar18;
      local_770.renderTimeSeconds.optionalValue = aVar9;
      if (uVar18 != 0 && -1 < (long)TVar2) {
        uVar12 = (ulong)uVar18;
      }
      local_770.cameraFromWorld.optionalValue._0_8_ = uVar21 | uVar12 << 0x20;
    }
    iVar23 = (int)local_8e0 - (int)aVar9;
    if ((int)aVar9 <= (int)local_8e0) {
      if ((int)aStack_8d8 <= (int)local_770.cameraFromWorld.optionalValue.__align) {
        iVar8 = iStack_8dc - local_770.renderTimeSeconds._4_4_;
        if ((int)local_770.renderTimeSeconds._4_4_ <= iStack_8dc) {
          if (iStack_8d4 <= (int)local_770.cameraFromWorld.optionalValue._4_4_) {
            iVar17 = (int)aStack_8d8 - (int)aVar9;
            iVar20 = iStack_8d4 - local_770.renderTimeSeconds._4_4_;
            iVar5 = iVar23;
            if (iVar17 < iVar23) {
              iVar5 = iVar17;
            }
            iVar6 = iVar8;
            if (iVar20 < iVar8) {
              iVar6 = iVar20;
            }
            local_830.alloc.memoryResource = (memory_resource *)CONCAT44(iVar6,iVar5);
            if (iVar17 < iVar23) {
              iVar17 = iVar23;
            }
            if (iVar20 < iVar8) {
              iVar20 = iVar8;
            }
            local_830.ptr = (float *)CONCAT44(iVar20,iVar17);
            pIVar14 = pstd::optional<pbrt::Image>::value(&local_4e0);
            AVar11.memoryResource = pstd::pmr::new_delete_resource();
            Image::Crop((Image *)local_668,pIVar14,(Bounds2i *)&local_830,AVar11);
            pIVar14 = pstd::optional<pbrt::Image>::value(&local_4e0);
            Image::operator=(pIVar14,(Image *)local_668);
            Image::~Image((Image *)local_668);
            pIVar14 = pstd::optional<pbrt::Image>::value(&local_4e0);
            local_668._0_8_ = (pIVar14->resolution).super_Tuple2<pbrt::Point2,_int>;
            auVar26._8_8_ = 0;
            auVar26._0_4_ = aStack_8d8;
            auVar26[4] = iStack_8d4._0_1_;
            auVar26._5_3_ = iStack_8d4._1_3_;
            auVar28._8_8_ = 0;
            auVar28._0_4_ = local_8e0;
            auVar28[4] = iStack_8dc._0_1_;
            auVar28._5_3_ = iStack_8dc._1_3_;
            auVar3 = vpsubd_avx(auVar26,auVar28);
            local_800.alloc.memoryResource = auVar3._0_8_;
            if ((auVar3._0_4_ != SUB84(local_668._0_8_,0)) ||
               (auVar3._4_4_ != SUB84(local_668._0_8_,4))) {
              LogFatal<char_const(&)[29],char_const(&)[32],char_const(&)[29],pbrt::Point2<int>&,char_const(&)[32],pbrt::Point2<int>&>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                         ,0xba,"Check failed: %s == %s with %s = %s, %s = %s",
                         (char (*) [29])"referenceImage->Resolution()",
                         (char (*) [32])"Point2i(pixelBounds.Diagonal())",
                         (char (*) [29])"referenceImage->Resolution()",(Point2<int> *)local_668,
                         (char (*) [32])"Point2i(pixelBounds.Diagonal())",(Point2<int> *)&local_800)
              ;
            }
            pFVar15 = fopen(*(char **)(Options + 0x68),"w");
            lVar19 = Options;
            if (pFVar15 == (FILE *)0x0) {
              LastError();
              ErrorString_abi_cxx11_(in_stack_fffffffffffff704);
              ErrorExit<std::__cxx11::string&,std::__cxx11::string>
                        ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(lVar19 + 0x68),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_668);
            }
            ImageAndMetadata::~ImageAndMetadata((ImageAndMetadata *)local_3c0);
            goto LAB_003e5dea;
          }
        }
      }
    }
    ErrorExit<pbrt::Bounds2<int>&,pbrt::Bounds2<int>&>
              ("Output image pixel bounds %s aren\'t inside the MSE image\'s pixel bounds %s.",
               (Bounds2<int> *)&local_8e0.__align,(Bounds2<int> *)&local_770);
  }
  pFVar15 = (FILE *)0x0;
LAB_003e5dea:
  if (*(long *)(Options + 0xb0) != 0) {
    local_770.renderTimeSeconds =
         *(optional<float> *)
          ((((TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              *)local_8c0)->bits & 0xffffffffffff) + 0x340);
    FilmHandle::GetFilename_abi_cxx11_((string *)local_668,(FilmHandle *)&local_770);
    auVar27._8_8_ = 0;
    auVar27._0_4_ = aStack_8d8;
    auVar27[4] = iStack_8d4._0_1_;
    auVar27._5_3_ = iStack_8d4._1_3_;
    auVar29._8_8_ = 0;
    auVar29._0_4_ = local_8e0;
    auVar29[4] = iStack_8dc._0_1_;
    auVar29._5_3_ = iStack_8dc._1_3_;
    auVar3 = vpsubd_avx(auVar27,auVar29);
    local_830.alloc.memoryResource = auVar3._0_8_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c0,"R",(allocator<char> *)&local_800);
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_3c0 + 0x20),"G",&local_8e1);
    std::__cxx11::string::string<std::allocator<char>>(local_380,"B",&local_8e2);
    __l._M_len = 3;
    __l._M_array = (iterator)local_3c0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_7d0,__l,&local_8e3);
    oVar7 = local_770.renderTimeSeconds;
    local_7a0._M_unused._M_object = (void *)0x0;
    local_7a0._8_8_ = 0;
    pcStack_790 = (code *)0x0;
    pcStack_788 = (code *)0x0;
    local_7a0._M_unused._M_object = operator_new(0x18);
    *(optional<float> *)local_7a0._M_unused._0_8_ = oVar7;
    pcStack_788 = std::
                  _Function_handler<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:198:24)>
                  ::_M_invoke;
    pcStack_790 = std::
                  _Function_handler<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:198:24)>
                  ::_M_manager;
    *(optional<float> *)((long)local_7a0._M_unused._0_8_ + 8) = _local_8e0;
    *(optional<float> *)((long)local_7a0._M_unused._0_8_ + 0x10) = _aStack_8d8;
    DisplayDynamic((string *)local_668,(Point2i *)&local_830,&local_7d0,
                   (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)&local_7a0
                  );
    std::_Function_base::~_Function_base((_Function_base *)&local_7a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_7d0);
    lVar19 = 0x40;
    do {
      std::__cxx11::string::~string((string *)(local_3c0 + lVar19));
      lVar19 = lVar19 + -0x20;
    } while (lVar19 != -0x20);
    std::__cxx11::string::~string((string *)local_668);
  }
  local_8a0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x1;
  local_8a0.set = false;
  local_8a0._5_3_ = 0;
  local_888 = &local_590;
  local_890 = &local_770.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
  pIVar22 = local_8c8;
  local_8a8 = pFVar15;
  while ((int)local_8f0 < (int)local_8ec) {
    local_880._M_unused._M_object = (void *)0x0;
    local_880._8_8_ = 0;
    pcStack_870 = (code *)0x0;
    pcStack_868 = (code *)0x0;
    local_880._M_unused._M_object = operator_new(0x30);
    *(undefined1 **)local_880._M_unused._0_8_ = local_850;
    *(_Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> **)
     ((long)local_880._M_unused._0_8_ + 8) = &local_7b8;
    *(uint **)((long)local_880._M_unused._0_8_ + 0x10) = &local_8f0;
    *(uint **)((long)local_880._M_unused._0_8_ + 0x18) = &local_8e8;
    *(ImageTileIntegrator **)((long)local_880._M_unused._0_8_ + 0x20) = pIVar22;
    *(ProgressReporter **)((long)local_880._M_unused._0_8_ + 0x28) = &local_550;
    pcStack_868 = std::
                  _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:212:36)>
                  ::_M_invoke;
    pcStack_870 = std::
                  _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:212:36)>
                  ::_M_manager;
    ParallelFor2D((pbrt *)&local_8e0.__align,(Bounds2i *)&local_880,
                  (function<void_(pbrt::Bounds2<int>)> *)
                  std::
                  _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:212:36)>
                  ::_M_invoke);
    std::_Function_base::~_Function_base((_Function_base *)&local_880);
    local_8f0 = local_8e8;
    local_8e8 = local_8e8 + (int)local_8a0.optionalValue;
    if ((int)local_8ec <= (int)local_8e8) {
      local_8e8 = local_8ec;
    }
    uVar16 = (int)local_8a0.optionalValue * 2;
    uVar12 = (ulong)uVar16;
    if (0x3f < (int)uVar16) {
      uVar12 = 0x40;
    }
    local_8a0 = (optional<float>)((ulong)local_8a0 & 0xffffffff);
    if (local_4e0.set == false) {
      local_8a0 = (optional<float>)uVar12;
    }
    if (LOGGING_LogLevel < 1) {
      Log<int&>(Verbose,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                ,0xf4,"Writing image with spp = %d",(int *)&local_8f0);
    }
    local_668[4] = 0;
    local_668[0x48] = 0;
    local_668[0x8c] = 0;
    local_668[0xa0] = false;
    local_5bc = false;
    local_5b8.set = false;
    local_5b0[0].set = false;
    local_5a0 = false;
    local_590._M_color = _S_red;
    local_590._M_parent = (_Base_ptr)0x0;
    local_590._M_left = local_888;
    local_590._M_right = local_888;
    local_570.memoryResource = (memory_resource *)0x0;
    dVar25 = Timer::ElapsedSeconds(&local_550.timer);
    local_3c0._0_4_ = (float)dVar25;
    pstd::optional<float>::operator=((optional<float> *)local_668,(float *)local_3c0);
    pstd::optional<int>::operator=(&local_5b8,(int *)&local_8f0);
    if (local_4e0.set == true) {
      local_770.renderTimeSeconds.set = false;
      local_770.cameraFromWorld.set = false;
      local_770.NDCFromWorld.set = false;
      local_770.pixelBounds.set = false;
      local_770.fullResolution.set = false;
      local_770.samplesPerPixel.set = false;
      local_770.MSE.set = false;
      local_770.colorSpace.set = false;
      local_770.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_770.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_770.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_890;
      local_770.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_890;
      local_770.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_830.alloc.memoryResource =
           *(memory_resource **)
            ((((TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                *)local_8c0)->bits & 0xffffffffffff) + 0x340);
      FilmHandle::GetImage
                ((Image *)local_3c0,(FilmHandle *)&local_830,&local_770,1.0 / (float)(int)local_8f0)
      ;
      Image::AllChannelsDesc((ImageChannelDesc *)&local_800,(Image *)local_3c0);
      pIVar14 = pstd::optional<pbrt::Image>::value(&local_4e0);
      Image::MSE((ImageChannelValues *)&local_830,(Image *)local_3c0,(ImageChannelDesc *)&local_800,
                 pIVar14,(Image *)0x0);
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&local_800);
      uVar16 = local_8f0;
      FVar24 = ImageChannelValues::Average((ImageChannelValues *)&local_830);
      fprintf(local_8a8,"%d, %.9g\n",(double)FVar24,(ulong)uVar16);
      FVar24 = ImageChannelValues::Average((ImageChannelValues *)&local_830);
      local_800.alloc.memoryResource._0_4_ = FVar24;
      pstd::optional<float>::operator=(local_5b0,(float *)&local_800);
      fflush(local_8a8);
      InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector(&local_830);
      Image::~Image((Image *)local_3c0);
      ImageMetadata::~ImageMetadata(&local_770);
      pIVar22 = local_8c8;
    }
    CameraHandle::InitMetadata((CameraHandle *)local_8c0,(ImageMetadata *)local_668);
    local_3c0._0_8_ =
         *(undefined8 *)
          ((((TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              *)local_8c0)->bits & 0xffffffffffff) + 0x340);
    ImageMetadata::ImageMetadata(&local_178,(ImageMetadata *)local_668);
    FilmHandle::WriteImage((FilmHandle *)local_3c0,&local_178,1.0 / (float)(int)local_8f0);
    ImageMetadata::~ImageMetadata(&local_178);
    ImageMetadata::~ImageMetadata((ImageMetadata *)local_668);
  }
  if (local_8a8 != (FILE *)0x0) {
    fclose(local_8a8);
  }
  ProgressReporter::Done(&local_550);
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
        ,0x108,"Rendering finished");
  }
  pstd::optional<pbrt::Image>::~optional(&local_4e0);
  ProgressReporter::~ProgressReporter(&local_550);
  std::_Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::~_Vector_base
            (&local_7b8);
  std::vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>::~vector
            ((vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> *)local_850);
  CheckCallbackScope::~CheckCallbackScope(&local_8f1);
  return;
}

Assistant:

void ImageTileIntegrator::Render() {
    // Handle debugStart, if set
    if (!Options->debugStart.empty()) {
        pstd::optional<std::vector<int>> c = SplitStringToInts(Options->debugStart, ',');
        if (!c)
            ErrorExit("Didn't find integer values after --debugstart: %s",
                      Options->debugStart);
        if (c->size() != 3)
            ErrorExit("Didn't find three integer values after --debugstart: %s",
                      Options->debugStart);

        Point2i pPixel((*c)[0], (*c)[1]);
        int sampleIndex = (*c)[2];

        ScratchBuffer scratchBuffer(65536);
        SamplerHandle tileSampler = samplerPrototype.Clone(1, Allocator())[0];
        tileSampler.StartPixelSample(pPixel, sampleIndex);

        EvaluatePixelSample(pPixel, sampleIndex, tileSampler, scratchBuffer);

        return;
    }

    thread_local Point2i threadPixel;
    thread_local int threadSampleIndex;
    CheckCallbackScope _([&]() {
        return StringPrintf("Rendering failed at pixel (%d, %d) sample %d. Debug with "
                            "\"--debugstart %d,%d,%d\"\n",
                            threadPixel.x, threadPixel.y, threadSampleIndex,
                            threadPixel.x, threadPixel.y, threadSampleIndex);
    });

    // Declare common variables for rendering image in tiles
    std::vector<ScratchBuffer> scratchBuffers;
    for (int i = 0; i < MaxThreadIndex(); ++i)
        scratchBuffers.push_back(ScratchBuffer(65536));

    std::vector<SamplerHandle> samplers = samplerPrototype.Clone(MaxThreadIndex());

    Bounds2i pixelBounds = camera.GetFilm().PixelBounds();
    int spp = samplerPrototype.SamplesPerPixel();
    ProgressReporter progress(int64_t(spp) * pixelBounds.Area(), "Rendering",
                              Options->quiet);

    int waveStart = 0, waveEnd = 1, nextWaveSize = 1;

    if (Options->recordPixelStatistics)
        StatsEnablePixelStats(pixelBounds,
                              RemoveExtension(camera.GetFilm().GetFilename()));
    // Handle MSE referene image, if provided
    pstd::optional<Image> referenceImage;
    FILE *mseOutFile = nullptr;
    if (!Options->mseReferenceImage.empty()) {
        auto mse = Image::Read(Options->mseReferenceImage);
        referenceImage = mse.image;

        Bounds2i msePixelBounds =
            mse.metadata.pixelBounds
                ? *mse.metadata.pixelBounds
                : Bounds2i(Point2i(0, 0), referenceImage->Resolution());
        if (!Inside(pixelBounds, msePixelBounds))
            ErrorExit("Output image pixel bounds %s aren't inside the MSE "
                      "image's pixel bounds %s.",
                      pixelBounds, msePixelBounds);

        // Transform the pixelBounds of the image we're rendering to the
        // coordinate system with msePixelBounds.pMin at the origin, which
        // in turn gives us the section of the MSE image to crop. (This is
        // complicated by the fact that Image doesn't support pixel
        // bounds...)
        Bounds2i cropBounds(Point2i(pixelBounds.pMin - msePixelBounds.pMin),
                            Point2i(pixelBounds.pMax - msePixelBounds.pMin));
        *referenceImage = referenceImage->Crop(cropBounds);
        CHECK_EQ(referenceImage->Resolution(), Point2i(pixelBounds.Diagonal()));

        mseOutFile = fopen(Options->mseReferenceOutput.c_str(), "w");
        if (!mseOutFile)
            ErrorExit("%s: %s", Options->mseReferenceOutput, ErrorString());
    }

    // Connect to display server if needed
    if (!Options->displayServer.empty()) {
        FilmHandle film = camera.GetFilm();
        DisplayDynamic(film.GetFilename(), Point2i(pixelBounds.Diagonal()),
                       {"R", "G", "B"},
                       [=](Bounds2i b, pstd::span<pstd::span<Float>> displayValue) {
                           int index = 0;
                           for (Point2i p : b) {
                               RGB rgb = film.GetPixelRGB(pixelBounds.pMin + p);
                               for (int c = 0; c < 3; ++c)
                                   displayValue[c][index] = rgb[c];
                               ++index;
                           }
                       });
    }

    // Render image in waves
    while (waveStart < spp) {
        // Render current wave's image tiles in parallel
        ParallelFor2D(pixelBounds, [&](Bounds2i tileBounds) {
            // Render image tile given by _tileBounds_
            ScratchBuffer &scratchBuffer = scratchBuffers[ThreadIndex];
            SamplerHandle &sampler = samplers[ThreadIndex];
            PBRT_DBG("Starting image tile (%d,%d)-(%d,%d) waveStart %d, waveEnd %d\n",
                     tileBounds.pMin.x, tileBounds.pMin.y, tileBounds.pMax.x,
                     tileBounds.pMax.y, waveStart, waveEnd);
            for (Point2i pPixel : tileBounds) {
                StatsReportPixelStart(pPixel);
                threadPixel = pPixel;
                // Render samples in pixel _pPixel_
                for (int sampleIndex = waveStart; sampleIndex < waveEnd; ++sampleIndex) {
                    threadSampleIndex = sampleIndex;
                    sampler.StartPixelSample(pPixel, sampleIndex);
                    EvaluatePixelSample(pPixel, sampleIndex, sampler, scratchBuffer);
                    scratchBuffer.Reset();
                }

                StatsReportPixelEnd(pPixel);
            }
            PBRT_DBG("Finished image tile (%d,%d)-(%d,%d)\n", tileBounds.pMin.x,
                     tileBounds.pMin.y, tileBounds.pMax.x, tileBounds.pMax.y);
            progress.Update((waveEnd - waveStart) * tileBounds.Area());
        });

        // Update start and end wave
        waveStart = waveEnd;
        waveEnd = std::min(spp, waveEnd + nextWaveSize);
        if (!referenceImage)
            nextWaveSize = std::min(2 * nextWaveSize, 64);

        // Write current image to disk
        LOG_VERBOSE("Writing image with spp = %d", waveStart);
        ImageMetadata metadata;
        metadata.renderTimeSeconds = progress.ElapsedSeconds();
        metadata.samplesPerPixel = waveStart;
        if (referenceImage) {
            ImageMetadata filmMetadata;
            Image filmImage = camera.GetFilm().GetImage(&filmMetadata, 1.f / waveStart);
            ImageChannelValues mse =
                filmImage.MSE(filmImage.AllChannelsDesc(), *referenceImage);
            fprintf(mseOutFile, "%d, %.9g\n", waveStart, mse.Average());
            metadata.MSE = mse.Average();
            fflush(mseOutFile);
        }
        camera.InitMetadata(&metadata);
        camera.GetFilm().WriteImage(metadata, 1.0f / waveStart);
    }

    if (mseOutFile)
        fclose(mseOutFile);
    progress.Done();
    LOG_VERBOSE("Rendering finished");
}